

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall
inja::ParserError::ParserError(ParserError *this,string *message,SourceLocation location)

{
  allocator<char> local_49;
  string local_48;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"parser_error",&local_49)
  ;
  InjaError::InjaError(&this->super_InjaError,&local_48,message,location);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&this->super_InjaError = &PTR__InjaError_00150550;
  return;
}

Assistant:

explicit ParserError(const std::string& message, SourceLocation location): InjaError("parser_error", message, location) {}